

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void createAxesMesh(void)

{
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *x;
  int iVar1;
  vec<3,_float,_(glm::qualifier)0> vVar2;
  vec<3,_float,_(glm::qualifier)0> vVar3;
  vec<3,_float,_(glm::qualifier)0> vVar4;
  int stride;
  vec3 local_a8 [2];
  vec3 BLUE2;
  vec3 BLUE1;
  vec3 GREEN2;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_54;
  vec3 GREEN1;
  vec3 RED2;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_24;
  vec3 RED1;
  float alpha;
  vec3 BG_COLOR3;
  u32 vbo;
  
  (*glad_debug_glGenVertexArrays)(1,&gpu::axesVao);
  (*glad_debug_glBindVertexArray)(gpu::axesVao);
  (*glad_debug_glGenBuffers)(1,(GLuint *)&BG_COLOR3.field_1);
  (*glad_debug_glBindBuffer)(0x8892,(GLuint)BG_COLOR3.field_1.y);
  stack0xffffffffffffffe8 = 0x3e4ccccd3dcccccd;
  BG_COLOR3.field_0.x = 0.1;
  RED1.field_1.y = 0.4;
  RED1.field_0.x = 0.0;
  RED2.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x3f800000;
  aStack_24 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  x = &RED1.field_2;
  vVar2 = glm::mix<3,float,float,(glm::qualifier)0>
                    ((vec<3,_float,_(glm::qualifier)0> *)x,
                     (vec<3,_float,_(glm::qualifier)0> *)&RED2.field_2,0.4);
  RED2.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar2.field_2;
  GREEN2.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
  aStack_54 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  vVar3 = glm::mix<3,float,float,(glm::qualifier)0>
                    ((vec<3,_float,_(glm::qualifier)0> *)x,
                     (vec<3,_float,_(glm::qualifier)0> *)&GREEN2.field_2,0.4);
  GREEN2.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar3.field_2;
  BLUE2.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  BLUE2.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
  vVar4 = glm::mix<3,float,float,(glm::qualifier)0>
                    ((vec<3,_float,_(glm::qualifier)0> *)x,
                     (vec<3,_float,_(glm::qualifier)0> *)&BLUE2.field_1,0.4);
  local_a8[0]._0_8_ = vVar4._0_8_;
  local_a8[0].field_2 = vVar4.field_2;
  BLUE2.field_0.x = local_a8[0].field_2.z;
  if (createAxesMesh()::verts == '\0') {
    iVar1 = __cxa_guard_acquire(&createAxesMesh()::verts);
    if (iVar1 != 0) {
      glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
                ((vec<3,float,(glm::qualifier)0> *)createAxesMesh::verts,-1,0,0);
      createAxesMesh::verts[0].color.field_2.z = RED2.field_0.x;
      createAxesMesh::verts[0].color._0_8_ = vVar2._0_8_;
      glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
                ((vec<3,float,(glm::qualifier)0> *)(createAxesMesh::verts + 1),0,0,0);
      createAxesMesh::verts[1].color.field_2.z = RED2.field_0.x;
      createAxesMesh::verts[1].color._0_8_ = vVar2._0_8_;
      glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
                ((vec<3,float,(glm::qualifier)0> *)(createAxesMesh::verts + 2),0,0,0);
      createAxesMesh::verts[2].color.field_2.z = RED1.field_0.x;
      createAxesMesh::verts[2].color.field_0.x = RED2.field_2.z;
      createAxesMesh::verts[2].color.field_1 = aStack_24;
      glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
                ((vec<3,float,(glm::qualifier)0> *)(createAxesMesh::verts + 3),1,0,0);
      createAxesMesh::verts[3].color.field_2.z = RED1.field_0.x;
      createAxesMesh::verts[3].color.field_0.x = RED2.field_2.z;
      createAxesMesh::verts[3].color.field_1 = aStack_24;
      glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
                ((vec<3,float,(glm::qualifier)0> *)(createAxesMesh::verts + 4),0,-1,0);
      createAxesMesh::verts[4].color.field_2.z = GREEN2.field_0.x;
      createAxesMesh::verts[4].color._0_8_ = vVar3._0_8_;
      glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
                ((vec<3,float,(glm::qualifier)0> *)(createAxesMesh::verts + 5),0,0,0);
      createAxesMesh::verts[5].color.field_2.z = GREEN2.field_0.x;
      createAxesMesh::verts[5].color._0_8_ = vVar3._0_8_;
      glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
                ((vec<3,float,(glm::qualifier)0> *)(createAxesMesh::verts + 6),0,0,0);
      createAxesMesh::verts[6].color.field_2.z = 0.0;
      createAxesMesh::verts[6].color.field_0.x = GREEN2.field_2.z;
      createAxesMesh::verts[6].color.field_1 = aStack_54;
      glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
                ((vec<3,float,(glm::qualifier)0> *)(createAxesMesh::verts + 7),0,1,0);
      createAxesMesh::verts[7].color.field_2.z = 0.0;
      createAxesMesh::verts[7].color.field_0.x = GREEN2.field_2.z;
      createAxesMesh::verts[7].color.field_1 = aStack_54;
      glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
                ((vec<3,float,(glm::qualifier)0> *)(createAxesMesh::verts + 8),0,0,-1);
      createAxesMesh::verts[8].color.field_2.z = BLUE2.field_0.x;
      createAxesMesh::verts[8].color.field_0 = local_a8[0].field_0;
      createAxesMesh::verts[8].color.field_1 = local_a8[0].field_1;
      glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
                ((vec<3,float,(glm::qualifier)0> *)(createAxesMesh::verts + 9),0,0,0);
      createAxesMesh::verts[9].color.field_2.z = BLUE2.field_0.x;
      createAxesMesh::verts[9].color.field_0 = local_a8[0].field_0;
      createAxesMesh::verts[9].color.field_1 = local_a8[0].field_1;
      glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
                ((vec<3,float,(glm::qualifier)0> *)(createAxesMesh::verts + 10),0,0,0);
      createAxesMesh::verts[10].color.field_2.z = 1.0;
      createAxesMesh::verts[10].color.field_0.x = BLUE2.field_1.y;
      createAxesMesh::verts[10].color.field_1.y = BLUE2.field_2.z;
      glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
                ((vec<3,float,(glm::qualifier)0> *)(createAxesMesh::verts + 0xb),0,0,1);
      createAxesMesh::verts[0xb].color.field_0.x = BLUE2.field_1.y;
      createAxesMesh::verts[0xb].color.field_1.y = BLUE2.field_2.z;
      createAxesMesh::verts[0xb].color.field_2.z = 1.0;
      __cxa_guard_release(&createAxesMesh()::verts);
    }
  }
  (*glad_debug_glBufferData)(0x8892,0x120,createAxesMesh::verts,0x88e4);
  (*glad_debug_glEnableVertexAttribArray)(0);
  (*glad_debug_glVertexAttribPointer)(0,3,0x1406,'\0',0x18,(void *)0x0);
  (*glad_debug_glEnableVertexAttribArray)(1);
  (*glad_debug_glVertexAttribPointer)(1,3,0x1406,'\0',0x18,(void *)0xc);
  return;
}

Assistant:

void createAxesMesh()
{
    glGenVertexArrays(1, &gpu::axesVao);
    glBindVertexArray(gpu::axesVao);
    u32 vbo;
    glGenBuffers(1, &vbo);
    glBindBuffer(GL_ARRAY_BUFFER, vbo);
    const vec3 BG_COLOR3 = BG_COLOR;
    struct Vert { vec3 pos, color; };
    const float alpha = 0.4f;
    const vec3 RED1 = {1, 0, 0};
    const vec3 RED2 = glm::mix(BG_COLOR3, RED1, alpha);
    const vec3 GREEN1 = {0, 1, 0};
    const vec3 GREEN2 = glm::mix(BG_COLOR3, GREEN1, alpha);
    const vec3 BLUE1 = {0, 0, 1};
    const vec3 BLUE2 = glm::mix(BG_COLOR3, BLUE1, alpha);
    static const Vert verts[] = {
        // X
        {{-1, 0, 0}, RED2},
        {{ 0, 0, 0}, RED2},
        {{ 0, 0, 0}, RED1},
        {{+1, 0, 0}, RED1},
        // Y
        {{0, -1, 0}, GREEN2},
        {{0,  0, 0}, GREEN2},
        {{0,  0, 0}, GREEN1},
        {{0, +1, 0}, GREEN1},
        // Z
        {{0, 0, -1}, BLUE2},
        {{0, 0,  0}, BLUE2},
        {{0, 0,  0}, BLUE1},
        {{0, 0, +1}, BLUE1}
    };
    constexpr int stride = 6 * sizeof(float);
    glBufferData(GL_ARRAY_BUFFER, sizeof(verts), verts, GL_STATIC_DRAW);
    glEnableVertexAttribArray(0);
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, stride, nullptr);
    glEnableVertexAttribArray(1);
    glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, stride, (void*)(3*sizeof(float)));
}